

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtoolbararealayout.cpp
# Opt level: O1

DockPosition __thiscall QToolBarAreaLayout::findToolBar(QToolBarAreaLayout *this,QToolBar *toolBar)

{
  undefined8 *puVar1;
  QToolBarAreaLayoutLine *pQVar2;
  ulong uVar3;
  int iVar4;
  undefined4 extraout_var;
  QToolBar *pQVar5;
  long lVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  bool bVar10;
  DockPosition local_4c;
  
  lVar7 = 0;
  do {
    iVar4 = 5;
    if (this->docks[lVar7].lines.d.size != 0) {
      uVar9 = 0;
      do {
        pQVar2 = this->docks[lVar7].lines.d.ptr;
        iVar4 = 0;
        bVar10 = pQVar2[uVar9].toolBarItems.d.size != 0;
        if (bVar10) {
          iVar4 = (*(pQVar2[uVar9].toolBarItems.d.ptr)->widgetItem->_vptr_QLayoutItem[0xd])();
          if ((QToolBar *)CONCAT44(extraout_var,iVar4) == toolBar) {
            iVar4 = 1;
            local_4c = (DockPosition)lVar7;
          }
          else {
            lVar6 = 0x18;
            uVar8 = 0;
            do {
              uVar8 = uVar8 + 1;
              uVar3 = pQVar2[uVar9].toolBarItems.d.size;
              bVar10 = uVar8 < uVar3;
              if (uVar3 <= uVar8) {
                iVar4 = 0;
                goto LAB_004b9089;
              }
              puVar1 = (undefined8 *)((long)&(pQVar2[uVar9].toolBarItems.d.ptr)->widgetItem + lVar6)
              ;
              lVar6 = lVar6 + 0x18;
              pQVar5 = (QToolBar *)(**(code **)(*(long *)*puVar1 + 0x68))();
            } while (pQVar5 != toolBar);
            iVar4 = 1;
            local_4c = (DockPosition)lVar7;
          }
        }
LAB_004b9089:
        if (bVar10) goto LAB_004b90ae;
        uVar9 = uVar9 + 1;
      } while (uVar9 < (ulong)this->docks[lVar7].lines.d.size);
      iVar4 = 5;
    }
LAB_004b90ae:
    if ((iVar4 != 5) && (iVar4 != 0)) {
      return local_4c;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return DockCount;
    }
  } while( true );
}

Assistant:

QInternal::DockPosition QToolBarAreaLayout::findToolBar(const QToolBar *toolBar) const
{
    for (int i = 0; i < QInternal::DockCount; ++i) {
        const QToolBarAreaLayoutInfo &dock = docks[i];

        for (int j = 0; j < dock.lines.size(); ++j) {
            const QToolBarAreaLayoutLine &line = dock.lines.at(j);

            for (int k = 0; k < line.toolBarItems.size(); ++k) {
                if (line.toolBarItems.at(k).widgetItem->widget() == toolBar)
                    return static_cast<QInternal::DockPosition>(i);
            }
        }
    }

    return QInternal::DockCount;
}